

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmExhaustiveRgb.cpp
# Opt level: O3

void __thiscall AlgorithmExhaustiveRgb::Iterate(AlgorithmExhaustiveRgb *this)

{
  qulonglong *pqVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  QRgb QVar6;
  QRgb a;
  QRgb QVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int local_7c;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/SebastianTroy[P]allRGB/AlgorithmExhaustiveRgb.cpp:34:29)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/SebastianTroy[P]allRGB/AlgorithmExhaustiveRgb.cpp:34:29)>
             ::_M_manager;
  iVar13 = (int)this + 0x28;
  iVar14 = (int)this + 0x10;
  iVar12 = this->outerX;
  local_7c = 0;
  local_50._M_unused._M_object = this;
  do {
    iVar4 = QImage::width();
    if (iVar4 <= iVar12) {
      this->outerX = 0;
LAB_0010ca6b:
      Iterate::OnExit::~OnExit((OnExit *)&local_50);
      return;
    }
    iVar12 = this->outerY;
    while( true ) {
      iVar4 = QImage::height();
      if (iVar4 <= iVar12) break;
      iVar12 = this->innerX;
      while( true ) {
        iVar4 = QImage::width();
        if (iVar4 <= iVar12) break;
        iVar12 = 100000;
        if (100000 < local_7c) {
          iVar12 = local_7c;
        }
        iVar4 = this->innerY;
        while( true ) {
          iVar5 = QImage::height();
          if (iVar5 <= iVar4) break;
          iVar4 = this->outerX;
          uVar2 = this->outerY;
          iVar5 = this->innerX;
          uVar3 = this->innerY;
          QVar6 = QImage::pixel(iVar13,iVar4);
          a = QImage::pixel(iVar13,iVar5);
          QVar7 = QImage::pixel(iVar14,iVar4);
          iVar8 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar6,QVar7);
          QVar7 = QImage::pixel(iVar14,iVar5);
          iVar9 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,QVar7);
          QVar7 = QImage::pixel(iVar14,iVar5);
          iVar10 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar6,QVar7);
          QVar6 = QImage::pixel(iVar14,iVar4);
          iVar11 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,QVar6);
          if (iVar11 + iVar10 < iVar9 + iVar8) {
            QImage::setPixel(iVar13,iVar4,uVar2);
            QImage::setPixel(iVar13,iVar5,uVar3);
            pqVar1 = &(this->super_AlgorithmBase).improvements_;
            *pqVar1 = *pqVar1 + 1;
            goto LAB_0010ca2c;
          }
          if (iVar12 == local_7c) goto LAB_0010ca6b;
          local_7c = local_7c + 1;
          iVar4 = this->innerY + 1;
          this->innerY = iVar4;
        }
        this->innerY = 0;
        iVar12 = this->innerX + 1;
        this->innerX = iVar12;
      }
      this->innerX = 0;
LAB_0010ca2c:
      iVar12 = this->outerY + 1;
      this->outerY = iVar12;
    }
    this->outerY = 0;
    iVar12 = this->outerX + 1;
    this->outerX = iVar12;
  } while( true );
}

Assistant:

void AlgorithmExhaustiveRgb::Iterate()
{
    struct OnExit {
        std::function<void()> onExit;
        ~OnExit()
        {
            onExit();
        }
    };

    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;

    auto exigGuard = OnExit{[&]()
    {
        iterations_ += repeats;

        emit onIterationsChanged(iterations_);
        emit onImprovementsChanged(improvements_);
    }};

    int repeat = 0;

    for (; outerX < allRgb_.width(); ++outerX) {
        for (; outerY < allRgb_.height(); ++outerY) {
            for (; innerX < allRgb_.width(); ++innerX) {
                for (; innerY < allRgb_.height(); ++innerY) {
                    QPoint aLoc{ outerX, outerY };
                    QPoint bLoc{ innerX, innerY };
                    QRgb a = allRgb_.pixel(aLoc);
                    QRgb b = allRgb_.pixel(bLoc);

                    int aDifference = ColourDifference(a, target_.pixel(aLoc));
                    int bDifference = ColourDifference(b, target_.pixel(bLoc));

                    int aSwappedDifference = ColourDifference(a, target_.pixel(bLoc));
                    int bSwappedDifference = ColourDifference(b, target_.pixel(aLoc));

                    if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
                        allRgb_.setPixel(aLoc, b);
                        allRgb_.setPixel(bLoc, a);
                        ++improvements_;
                        goto next;
                    }

                    if (++repeat > repeats) {
                        return;
                    }
                }
                innerY = 0;
            }
            innerX = 0;
next:;
        }
        outerY = 0;
    }
    outerX = 0;
}